

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall chaiscript::parser::ChaiScript_Parser::Class_Statements(ChaiScript_Parser *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = false;
  do {
    bVar2 = Def(this,true);
    bVar3 = true;
    bVar4 = true;
    if (!bVar2) {
      bVar2 = Var_Decl(this,true);
      bVar3 = true;
      bVar4 = true;
      if (!bVar2) {
        SkipWS(this,false);
        bVar3 = Eol_(this,false);
        bVar4 = bVar1;
        if (bVar3) {
          bVar4 = true;
        }
      }
    }
    bVar1 = bVar4;
  } while (bVar3 != false);
  return bVar4;
}

Assistant:

bool Class_Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true) || Var_Decl(true)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }